

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ixgbe.hpp
# Opt level: O3

void __thiscall ixy::IxgbeDevice::~IxgbeDevice(IxgbeDevice *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  (this->super_IxyDevice)._vptr_IxyDevice = (_func_int **)&PTR__IxgbeDevice_00112c40;
  std::vector<ixy::ixgbe_tx_queue,_std::allocator<ixy::ixgbe_tx_queue>_>::~vector(&this->tx_queues);
  std::vector<ixy::ixgbe_rx_queue,_std::allocator<ixy::ixgbe_rx_queue>_>::~vector(&this->rx_queues);
  pcVar1 = (this->pci_addr)._M_dataplus._M_p;
  paVar2 = &(this->pci_addr).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

static auto
    init(const std::string &pci_addr, uint16_t num_rx_queues,
         uint16_t num_tx_queues) -> std::unique_ptr<IxgbeDevice> {
        if (getuid()) {
            warn("not running as root, this will probably fail");
        }

        if (num_rx_queues > MAX_QUEUES) {
            error("cannot configure " << num_rx_queues << " rx queues: limit is " << MAX_QUEUES);
        }

        if (num_tx_queues > MAX_QUEUES) {
            error("cannot configure " << num_tx_queues << " tx queues: limit is " << MAX_QUEUES);
        }

        std::vector<ixgbe_rx_queue> rx_queues;
        std::vector<ixgbe_tx_queue> tx_queues;

        rx_queues.reserve(num_rx_queues);
        tx_queues.reserve(num_tx_queues);

        auto mapped_region = pci_map_resource(pci_addr);

        auto addr = mapped_region.first;
        auto len = mapped_region.second;

        auto dev = IxgbeDevice{pci_addr, addr, len, num_rx_queues, num_tx_queues, rx_queues, tx_queues};

        dev.reset_and_init();

        return std::make_unique<IxgbeDevice>(std::move(dev));
    }